

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# se.cpp
# Opt level: O2

void camera_fun(char *ip,int port,int device,int quality)

{
  int __fd;
  allocator local_185;
  int quality_local;
  _InputArray local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buff;
  sockaddr_in addrRec;
  vector<int,_std::allocator<int>_> params;
  VideoCapture capture;
  Mat frame;
  Mat capframe;
  
  addrRec.sin_family = 2;
  addrRec.sin_port = (ushort)port << 8 | (ushort)port >> 8;
  quality_local = quality;
  addrRec.sin_addr.s_addr = inet_addr(ip);
  __fd = socket(2,2,0);
  if (__fd < 0) {
    printf("%d create socket fail\n",port);
    return;
  }
  cv::VideoCapture::VideoCapture(&capture,device,0);
  cv::Mat::Mat(&capframe);
  params.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  params.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  params.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  _frame = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&params,(int *)&frame);
  std::vector<int,_std::allocator<int>_>::push_back(&params,&quality_local);
  do {
    cv::VideoCapture::operator>>(&capture,&capframe);
    buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&frame,".jpg",&local_185);
    local_180.sz.width = 0;
    local_180.sz.height = 0;
    local_180.flags = 0x1010000;
    local_180.obj = &capframe;
    cv::imencode((string *)&frame,&local_180,(vector *)&buff,(vector *)&params);
    std::__cxx11::string::~string((string *)&frame);
    local_180.sz.width = 0;
    local_180.sz.height = 0;
    local_180.flags = -0x7efd0000;
    local_180.obj = (vector *)&buff;
    cv::imdecode((_InputArray *)&frame,(int)&local_180);
    sendto(__fd,buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
           (long)buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,0,(sockaddr *)&addrRec,0x10);
    cv::waitKey(10);
    cv::Mat::~Mat(&frame);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&buff);
  } while( true );
}

Assistant:

void camera_fun(char ip[],int port ,int device,int quality){

	struct sockaddr_in addrRec;

	addrRec.sin_family = AF_INET;
	addrRec.sin_port = htons(port);//
	addrRec.sin_addr.s_addr = inet_addr(ip);//
	
	int sockClient = socket(AF_INET, SOCK_DGRAM, 0);

	if(sockClient < 0){
		printf("%d create socket fail\n",port);
		return ;
	}

	int nLen = sizeof(sockaddr_in);
 
	VideoCapture capture(device);
	Mat capframe;
	
	std::vector<int> params;
	params.push_back(IMWRITE_JPEG_QUALITY);
	params.push_back(quality);

	while (1)
	{
		capture >> capframe;
		std::vector<uchar> buff;
		imencode(".jpg", capframe, buff, params);
	
		Mat frame = imdecode(buff, -1);
		sendto(sockClient, (char *)&buff[0],buff.size() , 0, (struct sockaddr*)&addrRec, nLen);
		waitKey(10);
	}


	close(sockClient);
}